

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

void __thiscall absl::lts_20250127::crc_internal::CRC32::InitTables(CRC32 *this)

{
  int i;
  uint uVar1;
  int iVar2;
  Uint32By256 *t;
  long lVar3;
  uint32_t (*pauVar4) [256];
  size_t b;
  ulong uVar5;
  ulong uVar6;
  Uint32By256 *pauVar7;
  long lVar8;
  bool bVar9;
  
  t = (Uint32By256 *)operator_new__(0x1000);
  CRCImpl::FillWordTable(0x82f63b78,0x82f63b78,1,t);
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    this->table0_[lVar3] = (*t)[lVar3];
  }
  uVar6 = 0x82f63b78;
  lVar3 = 0xc;
  while( true ) {
    bVar9 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar9) break;
    uVar6 = (ulong)((uint32_t)uVar6 >> 8 ^ this->table0_[uVar6 & 0xff]);
  }
  CRCImpl::FillWordTable(0x82f63b78,(uint32_t)uVar6,4,t);
  pauVar4 = this->table_;
  pauVar7 = t;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
      (*pauVar4)[lVar8] = (*pauVar7)[lVar8];
    }
    pauVar7 = pauVar7 + 1;
    pauVar4 = pauVar4 + 1;
  }
  uVar1 = CRCImpl::FillZeroesTable(0x82f63b78,t);
  if ((int)uVar1 < 0x101) {
    uVar5 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      this->zeroes_[uVar5] = (*t)[uVar5];
    }
    operator_delete__(t);
    CRCImpl::FillWordTable(0x8f6e37a0,0x8f6e37a0,1,&this->reverse_table0_);
    iVar2 = CRCImpl::FillZeroesTable(0x8f6e37a0,&this->reverse_zeroes_);
    if (iVar2 < 0x101) {
      return;
    }
    raw_log_internal::RawLog
              (kFatal,"crc.cc",0xfd,"Check %s failed: %s",
               "j <= static_cast<int>(ABSL_ARRAYSIZE(this->reverse_zeroes_))",
               anon_var_dwarf_651463 + 5);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/crc/internal/crc.cc"
                  ,0xfd,"virtual void absl::crc_internal::CRC32::InitTables()");
  }
  raw_log_internal::RawLog
            (kFatal,"crc.cc",0xd0,"Check %s failed: %s",
             "j <= static_cast<int>(ABSL_ARRAYSIZE(this->zeroes_))",anon_var_dwarf_651463 + 5);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/crc/internal/crc.cc"
                ,0xd0,"virtual void absl::crc_internal::CRC32::InitTables()");
}

Assistant:

void CRC32::InitTables() {
  // Compute the table for extending a CRC by one byte.
  Uint32By256* t = new Uint32By256[4];
  FillWordTable(kCrc32cPoly, kCrc32cPoly, 1, t);
  for (int i = 0; i != 256; i++) {
    this->table0_[i] = t[0][i];
  }

  // Construct a table for updating the CRC by 4 bytes data followed by
  // 12 bytes of zeroes.
  //
  // Note: the data word size could be larger than the CRC size; it might
  // be slightly faster to use a 64-bit data word, but doing so doubles the
  // table size.
  uint32_t last = kCrc32cPoly;
  const size_t size = 12;
  for (size_t i = 0; i < size; ++i) {
    last = (last >> 8) ^ this->table0_[last & 0xff];
  }
  FillWordTable(kCrc32cPoly, last, 4, t);
  for (size_t b = 0; b < 4; ++b) {
    for (int i = 0; i < 256; ++i) {
      this->table_[b][i] = t[b][i];
    }
  }

  int j = FillZeroesTable(kCrc32cPoly, t);
  ABSL_RAW_CHECK(j <= static_cast<int>(ABSL_ARRAYSIZE(this->zeroes_)), "");
  for (int i = 0; i < j; i++) {
    this->zeroes_[i] = t[0][i];
  }

  delete[] t;

  // Build up tables for _reversing_ the operation of doing CRC operations on
  // zero bytes.

  // In C++, extending `crc` by a single zero bit is done by the following:
  // (A)  bool low_bit_set = (crc & 1);
  //      crc >>= 1;
  //      if (low_bit_set) crc ^= kCrc32cPoly;
  //
  // In particular note that the high bit of `crc` after this operation will be
  // set if and only if the low bit of `crc` was set before it.  This means that
  // no information is lost, and the operation can be reversed, as follows:
  // (B)  bool high_bit_set = (crc & 0x80000000u);
  //      if (high_bit_set) crc ^= kCrc32cPoly;
  //      crc <<= 1;
  //      if (high_bit_set) crc ^= 1;
  //
  // Or, equivalently:
  // (C)  bool high_bit_set = (crc & 0x80000000u);
  //      crc <<= 1;
  //      if (high_bit_set) crc ^= ((kCrc32cPoly << 1) ^ 1);
  //
  // The last observation is, if we store our checksums in variable `rcrc`,
  // with order of the bits reversed, the inverse operation becomes:
  // (D)  bool low_bit_set = (rcrc & 1);
  //      rcrc >>= 1;
  //      if (low_bit_set) rcrc ^= ReverseBits((kCrc32cPoly << 1) ^ 1)
  //
  // This is the same algorithm (A) that we started with, only with a different
  // polynomial bit pattern.  This means that by building up our tables with
  // this alternate polynomial, we can apply the CRC algorithms to a
  // bit-reversed CRC checksum to perform inverse zero-extension.

  const uint32_t kCrc32cUnextendPoly =
      ReverseBits(static_cast<uint32_t>((kCrc32cPoly << 1) ^ 1));
  FillWordTable(kCrc32cUnextendPoly, kCrc32cUnextendPoly, 1, &reverse_table0_);

  j = FillZeroesTable(kCrc32cUnextendPoly, &reverse_zeroes_);
  ABSL_RAW_CHECK(j <= static_cast<int>(ABSL_ARRAYSIZE(this->reverse_zeroes_)),
                 "");
}